

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O0

void __thiscall
qclab::qgates::RotationX<std::complex<float>_>::RotationX
          (RotationX<std::complex<float>_> *this,real_type theta)

{
  real_type theta_local;
  RotationX<std::complex<float>_> *this_local;
  
  QRotationGate1<std::complex<float>_>::QRotationGate1
            (&this->super_QRotationGate1<std::complex<float>_>,0,theta,false);
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00757688;
  return;
}

Assistant:

RotationX( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }